

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::TraceStats> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::TraceStats>::operator=
          (CopyablePtr<perfetto::protos::gen::TraceStats> *this,
          CopyablePtr<perfetto::protos::gen::TraceStats> *other)

{
  TraceStats *this_00;
  CopyablePtr<perfetto::protos::gen::TraceStats> *other_local;
  CopyablePtr<perfetto::protos::gen::TraceStats> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::TraceStats,_std::default_delete<perfetto::protos::gen::TraceStats>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (TraceStats *)operator_new(0xb0);
  perfetto::protos::gen::TraceStats::TraceStats(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::TraceStats,_std::default_delete<perfetto::protos::gen::TraceStats>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }